

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu32 pager_cksum(Pager *pPager,uchar *zData)

{
  int local_20;
  sxu32 local_1c;
  int i;
  sxu32 cksum;
  uchar *zData_local;
  Pager *pPager_local;
  
  local_1c = pPager->cksumInit;
  local_20 = pPager->iPageSize;
  while (local_20 = local_20 + -200, 0 < local_20) {
    local_1c = zData[local_20] + local_1c;
  }
  return local_1c;
}

Assistant:

static sxu32 pager_cksum(Pager *pPager,const unsigned char *zData)
{
  sxu32 cksum = pPager->cksumInit;         /* Checksum value to return */
  int i = pPager->iPageSize-200;          /* Loop counter */
  while( i>0 ){
    cksum += zData[i];
    i -= 200;
  }
  return cksum;
}